

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::setOpacity(QGraphicsItem *this,qreal opacity)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  QGraphicsItemPrivate *pQVar4;
  long *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  bool wasFullyTransparent;
  qreal newOpacity;
  QVariant newOpacityVariant;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  InvalidateReason in_stack_ffffffffffffff1c;
  QGraphicsItemPrivate *in_stack_ffffffffffffff20;
  long *plVar5;
  QRectF *in_stack_ffffffffffffff60;
  QGraphicsItem *in_stack_ffffffffffffff68;
  QGraphicsScenePrivate *in_stack_ffffffffffffff70;
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  plVar5 = in_RDI;
  ::QVariant::QVariant(&local_48,in_XMM0_Qa);
  (**(code **)(*in_RDI + 0x108))(&local_28,in_RDI,0x19,&local_48);
  ::QVariant::~QVariant(&local_48);
  ::QVariant::toReal((bool *)local_28.data);
  pdVar3 = qBound<double>((double *)in_stack_ffffffffffffff20,
                          (double *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (double *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  dVar1 = *pdVar3;
  pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 1));
  if ((dVar1 != pQVar4->opacity) || (NAN(dVar1) || NAN(pQVar4->opacity))) {
    pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    bVar2 = QGraphicsItemPrivate::isOpacityNull(pQVar4);
    pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    pQVar4->opacity = dVar1;
    (**(code **)(*in_RDI + 0x108))(&local_68,in_RDI,0x1a,&local_28);
    ::QVariant::~QVariant(&local_68);
    pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    if (pQVar4->scene != (QGraphicsScene *)0x0) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)(in_RDI + 1));
      QGraphicsItemPrivate::invalidateParentGraphicsEffectsRecursively
                ((QGraphicsItemPrivate *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RDI + 1));
      if ((*(ulong *)&pQVar4->field_0x160 & 0x8000000000) == 0) {
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    *)(in_RDI + 1));
        QGraphicsItemPrivate::invalidateChildGraphicsEffectsRecursively
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      }
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)(in_RDI + 1));
      QGraphicsScene::d_func((QGraphicsScene *)0x97c022);
      QRectF::QRectF((QRectF *)&stack0xffffffffffffff60);
      pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RDI + 1));
      QGraphicsItemPrivate::isOpacityNull(pQVar4);
      QGraphicsScenePrivate::markDirty
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                 SUB81((ulong)plVar5 >> 0x38,0),SUB81((ulong)plVar5 >> 0x30,0),
                 SUB81((ulong)plVar5 >> 0x28,0),SUB81((ulong)plVar5 >> 0x20,0),
                 SUB81((ulong)plVar5 >> 0x18,0));
      if (bVar2) {
        pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)(in_RDI + 1));
        *(ulong *)&pQVar4->field_0x160 =
             *(ulong *)&pQVar4->field_0x160 & 0xffefffffffffffff | 0x10000000000000;
      }
    }
    pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    if ((*(ulong *)&pQVar4->field_0x160 >> 0x38 & 1) != 0) {
      QGraphicsObject::opacityChanged((QGraphicsObject *)0x97c0e9);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::setOpacity(qreal opacity)
{
    // Notify change.
    const QVariant newOpacityVariant(itemChange(ItemOpacityChange, opacity));

    // Normalized opacity
    qreal newOpacity = qBound(qreal(0), newOpacityVariant.toReal(), qreal(1));

    // No change? Done.
    if (newOpacity == d_ptr->opacity)
        return;

    bool wasFullyTransparent = d_ptr->isOpacityNull();
    d_ptr->opacity = newOpacity;

    // Notify change.
    itemChange(ItemOpacityHasChanged, newOpacityVariant);

    // Update.
    if (d_ptr->scene) {
#if QT_CONFIG(graphicseffect)
        d_ptr->invalidateParentGraphicsEffectsRecursively();
        if (!(d_ptr->flags & ItemDoesntPropagateOpacityToChildren))
            d_ptr->invalidateChildGraphicsEffectsRecursively(QGraphicsItemPrivate::OpacityChanged);
#endif // QT_CONFIG(graphicseffect)
        d_ptr->scene->d_func()->markDirty(this, QRectF(),
                                          /*invalidateChildren=*/true,
                                          /*force=*/false,
                                          /*ignoreOpacity=*/d_ptr->isOpacityNull());
        if (wasFullyTransparent)
            d_ptr->paintedViewBoundingRectsNeedRepaint = 1;
    }

    if (d_ptr->isObject)
        emit static_cast<QGraphicsObject *>(this)->opacityChanged();
}